

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void start_tracking(void)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  long trn;
  int z1;
  int y1;
  int x1;
  long local_68;
  double local_60;
  int local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  
  if (mpi_rank == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Tracking started for particles: ",0x20);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,particles_to_track_abi_cxx11_._M_dataplus._M_p,
                        particles_to_track_abi_cxx11_._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if (((((((xtr1 < 0.0) || (xtr2 < 0.0)) || (auVar19._8_8_ = 0, auVar19._0_8_ = ytr1, ytr1 < 0.0))
        || ((auVar22._8_8_ = 0, auVar22._0_8_ = ytr2, ytr2 < 0.0 ||
            (auVar25._8_8_ = 0, auVar25._0_8_ = ztr1, ztr1 < 0.0)))) ||
       ((auVar29._8_8_ = 0, auVar29._0_8_ = ztr2, ztr2 < 0.0 ||
        ((xlength <= xtr1 || (xlength <= xtr2)))))) || (ylength <= ytr1)) ||
     (((ylength <= ytr2 || (zlength <= ztr1)) || (zlength <= ztr2)))) {
    if (mpi_rank == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error - tracks outside of compulational domain",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      return;
    }
  }
  else {
    local_68 = 1;
    if (tr_init == false) {
      if (0 < n_tracks) {
        auVar19 = vunpcklpd_avx(auVar25,auVar19);
        auVar21 = ZEXT1664(auVar19);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dz;
        auVar19 = vunpcklpd_avx(auVar29,auVar22);
        auVar24 = ZEXT1664(auVar19);
        auVar30 = ZEXT1664(ZEXT816(0));
        iVar4 = -1;
        iVar9 = 0;
        auVar19 = vmovhpd_avx(auVar26,dy);
        auVar28 = ZEXT1664(auVar19);
        iVar15 = n_tracks;
        dVar16 = xtr1;
        dVar17 = xtr2;
        dVar18 = dx;
        do {
          dVar34 = (double)iVar9;
          dVar36 = (double)iVar15;
          iVar5 = (int)((dVar16 + (dVar34 * (dVar17 - dVar16)) / dVar36) / dVar18);
          auVar19 = vsubpd_avx(auVar24._0_16_,auVar21._0_16_);
          auVar31._0_8_ = dVar34 * auVar19._0_8_;
          auVar31._8_8_ = dVar34 * auVar19._8_8_;
          auVar35._8_8_ = dVar36;
          auVar35._0_8_ = dVar36;
          auVar19 = vdivpd_avx(auVar31,auVar35);
          auVar32._0_8_ = auVar21._0_8_ + auVar19._0_8_;
          auVar32._8_8_ = auVar21._8_8_ + auVar19._8_8_;
          auVar19 = vdivpd_avx(auVar32,auVar28._0_16_);
          auVar33._0_4_ = (int)auVar19._0_8_;
          auVar33._4_4_ = (int)auVar19._8_8_;
          auVar33._8_8_ = 0;
          uVar14 = n_sr;
          uVar12 = n_sr;
          if (((iVar4 != iVar5) ||
              (uVar2 = vpcmpeqd_avx512vl(auVar30._0_16_,auVar33), ((uVar2 & 0xf) >> 1 & 1) == 0)) ||
             ((uVar2 & 1) == 0)) {
            do {
              uVar12 = uVar12 - 1;
              if ((int)uVar14 < 2) {
                uVar14 = 0;
                break;
              }
              uVar14 = uVar14 - 1;
            } while (iVar5 < x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar12]);
            iVar15 = iVar5 - x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar14];
            if ((0 < (int)uVar14) && (iVar15 < nm)) {
              uVar14 = uVar14 - 1;
              iVar15 = (iVar15 + nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar14]) - nx_ich;
            }
            local_48 = auVar33;
            if (mpi_rank == uVar14) {
              lVar1 = *(long *)(*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)iVar15 * 8) +
                                         (long)auVar33._4_4_ * 8) + (long)auVar33._0_4_ * 0x10);
              lVar10 = std::__cxx11::string::find(-0x68,0x65);
              if ((lVar10 != -1) && (lVar10 = lVar1, lVar1 != 0)) {
                while( true ) {
                  dVar16 = *(double *)(lVar10 + 0x40);
                  if ((dVar16 == -1.0) && (!NAN(dVar16))) break;
                  lVar10 = *(long *)(lVar10 + 0x58);
                  if ((lVar10 == 0) || ((dVar16 == -1.0 && (!NAN(dVar16))))) goto LAB_0011ffa2;
                }
                *(int *)(lVar10 + 0x50) = (int)local_68;
                local_68 = local_68 + 1;
              }
LAB_0011ffa2:
              lVar10 = std::__cxx11::string::find(-0x68,0x70);
              if ((lVar10 != -1) && (lVar10 = lVar1, lVar1 != 0)) {
                while( true ) {
                  dVar16 = *(double *)(lVar10 + 0x40);
                  if ((dVar16 == 1.0) && (!NAN(dVar16))) break;
                  lVar10 = *(long *)(lVar10 + 0x58);
                  if ((lVar10 == 0) || ((dVar16 == 1.0 && (!NAN(dVar16))))) goto LAB_0011fff5;
                }
                *(int *)(lVar10 + 0x50) = (int)local_68;
                local_68 = local_68 + 1;
              }
LAB_0011fff5:
              lVar10 = std::__cxx11::string::find(-0x68,0x67);
              if ((lVar10 != -1) && (lVar10 = lVar1, lVar1 != 0)) {
                while( true ) {
                  dVar16 = *(double *)(lVar10 + 0x40);
                  if ((dVar16 == 0.0) && (!NAN(dVar16))) break;
                  lVar10 = *(long *)(lVar10 + 0x58);
                  if ((lVar10 == 0) || ((dVar16 == 0.0 && (!NAN(dVar16))))) goto LAB_00120044;
                }
                *(int *)(lVar10 + 0x50) = (int)local_68;
                local_68 = local_68 + 1;
              }
LAB_00120044:
              lVar10 = std::__cxx11::string::find(-0x68,0x69);
              pdVar3 = icmr;
              if ((lVar10 != -1) && (lVar10 = (long)n_ion_populations, 0 < lVar10)) {
                lVar11 = 0;
                lVar8 = local_68;
                do {
                  if (lVar1 != 0) {
                    dVar16 = pdVar3[lVar11];
                    lVar13 = lVar1;
                    while( true ) {
                      dVar17 = *(double *)(lVar13 + 0x40);
                      if ((dVar17 == dVar16) && (!NAN(dVar17) && !NAN(dVar16))) break;
                      lVar13 = *(long *)(lVar13 + 0x58);
                      if ((lVar13 == 0) || ((dVar17 == dVar16 && (!NAN(dVar17) && !NAN(dVar16)))))
                      goto LAB_001200a9;
                    }
                    *(int *)(lVar13 + 0x50) = (int)lVar8;
                    lVar8 = lVar8 + 1;
                    local_68 = lVar8;
                  }
LAB_001200a9:
                  lVar11 = lVar11 + 1;
                } while (lVar11 != lVar10);
              }
            }
            MPI_Bcast(&local_68,1,&ompi_mpi_long,uVar14,&ompi_mpi_comm_world);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = ztr1;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = ztr2;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dz;
            auVar30 = ZEXT1664(local_48);
            auVar19 = vmovhpd_avx(auVar20,ytr1);
            auVar21 = ZEXT1664(auVar19);
            auVar19 = vmovhpd_avx(auVar23,ytr2);
            auVar24 = ZEXT1664(auVar19);
            auVar19 = vmovhpd_avx(auVar27,dy);
            auVar28 = ZEXT1664(auVar19);
            iVar15 = n_tracks;
            iVar4 = iVar5;
            dVar16 = xtr1;
            dVar17 = xtr2;
            dVar18 = dx;
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < iVar15);
      }
    }
    else if (0 < n_tracks) {
      iVar15 = 0;
      do {
        local_60 = xtr2 - xtr1;
        local_48._0_8_ = xtr1;
        iVar4 = rand();
        dVar16 = ((double)iVar4 * local_60) / 2147483647.0 + (double)local_48._0_8_;
        local_48._0_8_ = ytr1;
        local_4c = (int)(dVar16 / dx);
        local_60 = ytr2 - ytr1;
        iVar4 = rand();
        dVar16 = ((double)iVar4 * local_60) / 2147483647.0 + (double)local_48._0_8_;
        local_48._0_8_ = ztr1;
        local_50 = (int)(dVar16 / dy);
        local_60 = ztr2 - ztr1;
        iVar4 = rand();
        local_54 = (int)((((double)iVar4 * local_60) / 2147483647.0 + (double)local_48._0_8_) / dz);
        MPI_Bcast(&local_4c,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&local_50,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Bcast(&local_54,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        lVar10 = (ulong)(uint)n_sr << 0x20;
        lVar1 = (long)(n_sr + -2);
        iVar4 = n_sr;
        uVar12 = n_sr;
        do {
          iVar9 = iVar4;
          lVar8 = lVar1;
          uVar12 = uVar12 - 1;
          if (iVar9 < 2) {
            iVar4 = 0;
            piVar7 = x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5 = local_4c;
            goto LAB_0011fbc7;
          }
          lVar10 = lVar10 + -0x100000000;
          iVar4 = iVar9 + -1;
          lVar1 = lVar8 + -1;
        } while (local_4c <
                 x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar12]);
        iVar5 = local_4c -
                *(int *)((long)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + (lVar10 >> 0x1e));
        if (iVar4 == 0) {
          iVar4 = 0;
        }
        else if (iVar5 < nm) {
          iVar4 = iVar9 + -2;
          piVar7 = &nx_ich;
          iVar5 = iVar5 + nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8];
LAB_0011fbc7:
          iVar5 = iVar5 - *piVar7;
        }
        if (mpi_rank == iVar4) {
          lVar1 = *(long *)(*(long *)(*(long *)(*(long *)((long)psr._M_t.
                                                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                                                  .super__Head_base<0UL,_spatial_region_*,_false>.
                                                  _M_head_impl + 0x218) + (long)iVar5 * 8) +
                                     (long)local_50 * 8) + (long)local_54 * 0x10);
          lVar10 = std::__cxx11::string::find(-0x68,0x65);
          if ((lVar10 != -1) && (lVar10 = lVar1, lVar1 != 0)) {
            while( true ) {
              dVar16 = *(double *)(lVar10 + 0x40);
              if ((dVar16 == -1.0) && (!NAN(dVar16))) break;
              lVar10 = *(long *)(lVar10 + 0x58);
              if ((lVar10 == 0) || ((dVar16 == -1.0 && (!NAN(dVar16))))) goto LAB_0011fc5c;
            }
            *(int *)(lVar10 + 0x50) = (int)local_68;
            local_68 = local_68 + 1;
          }
LAB_0011fc5c:
          lVar10 = std::__cxx11::string::find(-0x68,0x70);
          if ((lVar10 != -1) && (lVar10 = lVar1, lVar1 != 0)) {
            while( true ) {
              dVar16 = *(double *)(lVar10 + 0x40);
              if ((dVar16 == 1.0) && (!NAN(dVar16))) break;
              lVar10 = *(long *)(lVar10 + 0x58);
              if ((lVar10 == 0) || ((dVar16 == 1.0 && (!NAN(dVar16))))) goto LAB_0011fcb3;
            }
            *(int *)(lVar10 + 0x50) = (int)local_68;
            local_68 = local_68 + 1;
          }
LAB_0011fcb3:
          lVar10 = std::__cxx11::string::find(-0x68,0x67);
          if ((lVar10 != -1) && (lVar10 = lVar1, lVar1 != 0)) {
            while( true ) {
              dVar16 = *(double *)(lVar10 + 0x40);
              if ((dVar16 == 0.0) && (!NAN(dVar16))) break;
              lVar10 = *(long *)(lVar10 + 0x58);
              if ((lVar10 == 0) || ((dVar16 == 0.0 && (!NAN(dVar16))))) goto LAB_0011fd06;
            }
            *(int *)(lVar10 + 0x50) = (int)local_68;
            local_68 = local_68 + 1;
          }
LAB_0011fd06:
          lVar10 = std::__cxx11::string::find(-0x68,0x69);
          pdVar3 = icmr;
          if ((lVar10 != -1) && (lVar10 = (long)n_ion_populations, 0 < lVar10)) {
            lVar11 = 0;
            lVar8 = local_68;
            do {
              if (lVar1 != 0) {
                dVar16 = pdVar3[lVar11];
                lVar13 = lVar1;
                while( true ) {
                  dVar17 = *(double *)(lVar13 + 0x40);
                  if ((dVar17 == dVar16) && (!NAN(dVar17) && !NAN(dVar16))) break;
                  lVar13 = *(long *)(lVar13 + 0x58);
                  if ((lVar13 == 0) || ((dVar17 == dVar16 && (!NAN(dVar17) && !NAN(dVar16)))))
                  goto LAB_0011fd6f;
                }
                *(int *)(lVar13 + 0x50) = (int)lVar8;
                lVar8 = lVar8 + 1;
                local_68 = lVar8;
              }
LAB_0011fd6f:
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar10);
          }
        }
        MPI_Bcast(&local_68,1,&ompi_mpi_long,iVar4,&ompi_mpi_comm_world);
        iVar15 = iVar15 + 1;
      } while (iVar15 < n_tracks);
    }
    iVar15 = nm;
    exchange_fields(nm,nm);
    exchange_particles(iVar15,iVar15);
  }
  return;
}

Assistant:

void start_tracking()
{
    if (mpi_rank == 0) {
        cout << "Tracking started for particles: " << particles_to_track << endl;
    }
    if (xtr1 < 0 || xtr2 < 0 || ytr1 < 0 || ytr2 < 0 || ztr1 < 0 || ztr2 < 0 ||
        xtr1 >= xlength || xtr2 >= xlength || ytr1 >= ylength || ytr2 >= ylength || ztr1 >= zlength || ztr2 >= zlength)
    {
        if (mpi_rank == 0) {
            cout << "Error - tracks outside of compulational domain" << endl;
        }
        return;
    }
    long trn = 1; // trn = 0 for untracked particles
    if (tr_init==0) {
        int x1,y1,z1,x2,y2,z2;
        x1 = -1;
        y1 = 0;
        z1 = 0;
        for (int i=0;i<n_tracks;i++) {
            x2 = (xtr1 + (xtr2-xtr1)*i/n_tracks)/dx;
            y2 = (ytr1 + (ytr2-ytr1)*i/n_tracks)/dy;
            z2 = (ztr1 + (ztr2-ztr1)*i/n_tracks)/dz;
            if (x2!=x1 || y2!=y1 || z2!=z1) {
                x1 = x2;
                y1 = y2;
                z1 = z2;
                int n,x;
                n = get_sr_for_index(x2);
                x = x2 - x0_sr[n];
                if (n>0 && x<nm) {
                    n = n - 1;
                    x = x + nx_sr[n] - nx_ich;
                }
                if (mpi_rank == n) {
                    particle* h = psr->cp[x][y2][z2].pl.head;
                    particle* p = h;
                    bool b = 1;
                    if (particles_to_track.find('e') != string::npos)
                    {
                        while (p!=0 && b) {
                            if (p->cmr==-1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('p') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==1) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('g') != string::npos)
                    {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==0) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                    if (particles_to_track.find('i') != string::npos)
                    {
                        for (int m=0;m<n_ion_populations;m++) {
                            p = h;
                            b = 1;
                            while (p!=0 && b) {
                                if (p->cmr==icmr[m]) {
                                    p->trn = trn;
                                    trn++;
                                    b = 0;
                                }
                                p = p->next;
                            }
                        }
                    }
                }
                MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
            }
        }
    } else {
        for (int i=0;i<n_tracks;i++) {
            int x1 = ( xtr1 + ( xtr2 - xtr1 ) * rand( ) / RAND_MAX ) / dx;
            int y1 = ( ytr1 + ( ytr2 - ytr1 ) * rand( ) / RAND_MAX ) / dy;
            int z1 = ( ztr1 + ( ztr2 - ztr1 ) * rand( ) / RAND_MAX ) / dz;
            MPI_Bcast(&x1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&y1, 1, MPI_INT, 0, MPI_COMM_WORLD);
            MPI_Bcast(&z1, 1, MPI_INT, 0, MPI_COMM_WORLD);

            int n,x;
            n = get_sr_for_index(x1);
            x = x1 - x0_sr[n];
            if (n!=0 && x<nm) {
                n = n - 1;
                x = x + nx_sr[n] - nx_ich;
            }
            if (mpi_rank == n) {
                particle* h = psr->cp[x][y1][z1].pl.head;
                particle* p = h;
                bool b = 1;
                if (particles_to_track.find('e') != string::npos)
                {
                    while (p!=0 && b) {
                        if (p->cmr==-1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('p') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==1) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('g') != string::npos)
                {
                    p = h;
                    b = 1;
                    while (p!=0 && b) {
                        if (p->cmr==0) {
                            p->trn = trn;
                            trn++;
                            b = 0;
                        }
                        p = p->next;
                    }
                }
                if (particles_to_track.find('i') != string::npos)
                {
                    for (int m=0;m<n_ion_populations;m++) {
                        p = h;
                        b = 1;
                        while (p!=0 && b) {
                            if (p->cmr==icmr[m]) {
                                p->trn = trn;
                                trn++;
                                b = 0;
                            }
                            p = p->next;
                        }
                    }
                }
            }
            MPI_Bcast(&trn, 1, MPI_LONG, n, MPI_COMM_WORLD);
        }
    }

    // make the same particles tracked in all regions, so that tracks aren't lost at the first exchange
    synchronize_regions(false);
}